

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

TSymbol * __thiscall glslang::TSymbolTable::copyUpDeferredInsert(TSymbolTable *this,TSymbol *shared)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar2;
  TString *pTVar3;
  long *plVar4;
  undefined8 uVar5;
  TVariable *container;
  TAnonMember *anon;
  TSymbol *copy;
  TSymbol *shared_local;
  TSymbolTable *this_local;
  
  iVar1 = (*shared->_vptr_TSymbol[9])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*shared->_vptr_TSymbol[0xb])();
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar1);
    if (plVar4 == (long *)0x0) {
      __assert_fail("anon",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                    ,0x2f9,"TSymbol *glslang::TSymbolTable::copyUpDeferredInsert(TSymbol *)");
    }
    puVar2 = (undefined8 *)(**(code **)(*plVar4 + 0xb0))();
    this_local = (TSymbolTable *)(**(code **)*puVar2)();
    pTVar3 = NewPoolTString_abi_cxx11_("");
    (*(code *)(this_local->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[4])(this_local,pTVar3);
    plVar4 = (long *)(**(code **)(*plVar4 + 0xb0))();
    uVar5 = (**(code **)(*plVar4 + 0x78))();
    (*(code *)(this_local->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[0xe])(this_local,uVar5);
  }
  else {
    iVar1 = (**shared->_vptr_TSymbol)();
    this_local = (TSymbolTable *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*shared->_vptr_TSymbol[0xf])();
    (*(code *)(this_local->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[0xe])(this_local,iVar1);
  }
  return (TSymbol *)this_local;
}

Assistant:

TSymbol* copyUpDeferredInsert(TSymbol* shared)
    {
        if (shared->getAsVariable()) {
            TSymbol* copy = shared->clone();
            copy->setUniqueId(shared->getUniqueId());
            return copy;
        } else {
            const TAnonMember* anon = shared->getAsAnonMember();
            assert(anon);
            TVariable* container = anon->getAnonContainer().clone();
            container->changeName(NewPoolTString(""));
            container->setUniqueId(anon->getAnonContainer().getUniqueId());
            return container;
        }
    }